

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall CP::queue<int>::print(queue<int> *this)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  int *piVar5;
  int a;
  undefined1 local_30 [8];
  queue<int> x;
  queue<int> *this_local;
  
  x.mFront = (size_t)this;
  queue((queue<int> *)local_30,this);
  poVar3 = std::operator<<((ostream *)&std::cout,"Queue size = ");
  sVar4 = size((queue<int> *)local_30);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  std::operator<<(poVar3," Data = ");
  while( true ) {
    bVar2 = empty((queue<int> *)local_30);
    if (bVar2) break;
    piVar5 = front((queue<int> *)local_30);
    iVar1 = *piVar5;
    pop((queue<int> *)local_30);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar3," ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  ~queue((queue<int> *)local_30);
  return;
}

Assistant:

void print() {
      CP::queue<T> x(*this);
      std::cout << "Queue size = " << x.size() << " Data = ";
      while (x.empty() == false) {
        T a;
        a = x.front();
        x.pop();
        std::cout << a << " ";
      }
      std::cout << std::endl;
    }